

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

locateresult __thiscall
tetgenmesh::slocate(tetgenmesh *this,point searchpt,face *searchsh,int aflag,int cflag,int rflag)

{
  point pdVar1;
  unsigned_long uVar2;
  point pdVar3;
  point pc_00;
  bool bVar4;
  double dVar5;
  double dVar6;
  double local_c8;
  double area_cap;
  double area_bcp;
  double area_abp;
  double area_abc;
  double n [3];
  int local_84;
  int i;
  double ori_ca;
  double ori_bc;
  double ori;
  anon_enum_32 nextmove;
  locateresult loc;
  point pc;
  point pb;
  point pa;
  face neighsh;
  int rflag_local;
  int cflag_local;
  int aflag_local;
  face *searchsh_local;
  point searchpt_local;
  tetgenmesh *this_local;
  
  neighsh._12_4_ = rflag;
  face::face((face *)&pa);
  pb = sorg(this,searchsh);
  pc = sdest(this,searchsh);
  pdVar1 = sapex(this,searchsh);
  if (aflag == 0) {
    calculateabovepoint4(this,pb,pc,pdVar1,searchpt);
  }
  dVar5 = orient3d(pb,pc,pdVar1,this->dummypoint);
  if (dVar5 <= 0.0) {
    if ((dVar5 == 0.0) && (!NAN(dVar5))) {
      return UNKNOWN;
    }
  }
  else {
    sesymself(this,searchsh);
  }
  for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
    pb = sorg(this,searchsh);
    pc = sdest(this,searchsh);
    dVar5 = orient3d(pb,pc,this->dummypoint,searchpt);
    if (0.0 < dVar5) break;
    senextself(this,searchsh);
  }
  if (local_84 == 3) {
    this_local._4_4_ = UNKNOWN;
  }
  else {
    _nextmove = sapex(this,searchsh);
    if (_nextmove == searchpt) {
      senext2self(this,searchsh);
      this_local._4_4_ = ONVERTEX;
    }
    else {
      do {
        dVar5 = orient3d(pc,_nextmove,this->dummypoint,searchpt);
        dVar6 = orient3d(_nextmove,pb,this->dummypoint,searchpt);
        if (0.0 <= dVar5) {
          if (0.0 <= dVar6) {
            if (dVar5 <= 0.0) {
              if (dVar6 <= 0.0) {
                senext2self(this,searchsh);
                return ONVERTEX;
              }
              senextself(this,searchsh);
              ori._4_4_ = ONEDGE;
            }
            else if (dVar6 <= 0.0) {
              senext2self(this,searchsh);
              ori._4_4_ = ONEDGE;
            }
            else {
              ori._4_4_ = ONFACE;
            }
            if (neighsh._12_4_ != 0) {
              pdVar1 = sorg(this,searchsh);
              pdVar3 = sdest(this,searchsh);
              pc_00 = sapex(this,searchsh);
              facenormal(this,pdVar1,pdVar3,pc_00,&area_abc,1,(double *)0x0);
              dVar5 = dot(this,&area_abc,&area_abc);
              dVar5 = sqrt(dVar5);
              facenormal(this,pdVar3,pc_00,searchpt,&area_abc,1,(double *)0x0);
              dVar6 = dot(this,&area_abc,&area_abc);
              area_cap = sqrt(dVar6);
              if (area_cap / dVar5 < this->b->epsilon) {
                area_cap = 0.0;
              }
              facenormal(this,pc_00,pdVar1,searchpt,&area_abc,1,(double *)0x0);
              dVar6 = dot(this,&area_abc,&area_abc);
              local_c8 = sqrt(dVar6);
              if (local_c8 / dVar5 < this->b->epsilon) {
                local_c8 = 0.0;
              }
              if ((ori._4_4_ == ONFACE) || (ori._4_4_ == OUTSIDE)) {
                facenormal(this,pdVar1,pdVar3,searchpt,&area_abc,1,(double *)0x0);
                dVar6 = dot(this,&area_abc,&area_abc);
                area_bcp = sqrt(dVar6);
                if (area_bcp / dVar5 < this->b->epsilon) {
                  area_bcp = 0.0;
                }
              }
              else {
                area_bcp = 0.0;
              }
              if ((area_bcp != 0.0) || (NAN(area_bcp))) {
                if ((area_cap != 0.0) || (NAN(area_cap))) {
                  if ((local_c8 != 0.0) || (NAN(local_c8))) {
                    ori._4_4_ = ONFACE;
                  }
                  else {
                    senext2self(this,searchsh);
                    ori._4_4_ = ONEDGE;
                  }
                }
                else if ((local_c8 != 0.0) || (NAN(local_c8))) {
                  senextself(this,searchsh);
                  ori._4_4_ = ONEDGE;
                }
                else {
                  senext2self(this,searchsh);
                  ori._4_4_ = ONVERTEX;
                }
              }
              else if ((area_cap != 0.0) || (NAN(area_cap))) {
                if ((local_c8 != 0.0) || (NAN(local_c8))) {
                  ori._4_4_ = ONEDGE;
                }
                else {
                  ori._4_4_ = ONVERTEX;
                }
              }
              else {
                senextself(this,searchsh);
                ori._4_4_ = ONVERTEX;
              }
            }
            return ori._4_4_;
          }
          bVar4 = true;
        }
        else if (0.0 <= dVar6) {
          bVar4 = false;
        }
        else {
          uVar2 = randomnation(this,2);
          bVar4 = uVar2 != 0;
        }
        if (bVar4) {
          senext2self(this,searchsh);
        }
        else {
          senextself(this,searchsh);
        }
        if ((cflag == 0) && (searchsh->sh[(searchsh->shver >> 1) + 6] != (shellface)0x0)) {
          return ENCSEGMENT;
        }
        spivot(this,searchsh,(face *)&pa);
        if (pa == (point)0x0) {
          return OUTSIDE;
        }
        pdVar1 = sorg(this,(face *)&pa);
        pdVar3 = sdest(this,searchsh);
        if (pdVar1 != pdVar3) {
          sesymself(this,(face *)&pa);
        }
        face::operator=(searchsh,(face *)&pa);
        pb = sorg(this,searchsh);
        pc = sdest(this,searchsh);
        _nextmove = sapex(this,searchsh);
      } while (_nextmove != searchpt);
      senext2self(this,searchsh);
      this_local._4_4_ = ONVERTEX;
    }
  }
  return this_local._4_4_;
}

Assistant:

enum tetgenmesh::locateresult tetgenmesh::slocate(point searchpt, 
  face* searchsh, int aflag, int cflag, int rflag)
{
  face neighsh;
  point pa, pb, pc;
  enum locateresult loc;
  enum {MOVE_BC, MOVE_CA} nextmove;
  REAL ori, ori_bc, ori_ca;
  int i;

  pa = sorg(*searchsh);
  pb = sdest(*searchsh);
  pc = sapex(*searchsh);

  if (!aflag) {
    // No above point is given. Calculate an above point for this facet.
    calculateabovepoint4(pa, pb, pc, searchpt);
  }

  // 'dummypoint' is given. Make sure it is above [a,b,c]
  ori = orient3d(pa, pb, pc, dummypoint);
  if (ori > 0) {
    sesymself(*searchsh); // Reverse the face orientation.
  } else if (ori == 0.0) {
    // This case should not happen theoretically. But... 
    return UNKNOWN; 
  }

  // Find an edge of the face s.t. p lies on its right-hand side (CCW).
  for (i = 0; i < 3; i++) {
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    ori = orient3d(pa, pb, dummypoint, searchpt);
    if (ori > 0) break;
    senextself(*searchsh);
  }
  if (i == 3) {
    return UNKNOWN;
  }

  pc = sapex(*searchsh);

  if (pc == searchpt) {
    senext2self(*searchsh);
    return ONVERTEX;
  }

  while (1) {

    ori_bc = orient3d(pb, pc, dummypoint, searchpt);
    ori_ca = orient3d(pc, pa, dummypoint, searchpt);

    if (ori_bc < 0) {
      if (ori_ca < 0) { // (--)
        // Any of the edges is a viable move.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_BC;
        }
      } else { // (-#)
        // Edge [b, c] is viable.
        nextmove = MOVE_BC;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        // Edge [c, a] is viable.
        nextmove = MOVE_CA;
      } else {
        if (ori_bc > 0) {
          if (ori_ca > 0) { // (++)
            loc = ONFACE;  // Inside [a, b, c].
            break;
          } else { // (+0)
            senext2self(*searchsh); // On edge [c, a].
            loc = ONEDGE;
            break;
          }
        } else { // ori_bc == 0
          if (ori_ca > 0) { // (0+)
            senextself(*searchsh); // On edge [b, c].
            loc = ONEDGE;
            break;
          } else { // (00)
            // p is coincident with vertex c. 
            senext2self(*searchsh);
            return ONVERTEX;
          }
        }
      }
    }

    // Move to the next face.
    if (nextmove == MOVE_BC) {
      senextself(*searchsh);
    } else {
      senext2self(*searchsh);
    }
    if (!cflag) {
      // NON-convex case. Check if we will cross a boundary.
      if (isshsubseg(*searchsh)) {
        return ENCSEGMENT;
      }
    }
    spivot(*searchsh, neighsh);
    if (neighsh.sh == NULL) {
      return OUTSIDE; // A hull edge.
    }
    // Adjust the edge orientation.
    if (sorg(neighsh) != sdest(*searchsh)) {
      sesymself(neighsh);
    }

    // Update the newly discovered face and its endpoints.
    *searchsh = neighsh;
    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    if (pc == searchpt) {
      senext2self(*searchsh);
      return ONVERTEX;
    }

  } // while (1)

  // assert(loc == ONFACE || loc == ONEDGE);


  if (rflag) {
    // Round the locate result before return.
    REAL n[3], area_abc, area_abp, area_bcp, area_cap;

    pa = sorg(*searchsh);
    pb = sdest(*searchsh);
    pc = sapex(*searchsh);

    facenormal(pa, pb, pc, n, 1, NULL);
    area_abc = sqrt(dot(n, n));

    facenormal(pb, pc, searchpt, n, 1, NULL);
    area_bcp = sqrt(dot(n, n));
    if ((area_bcp / area_abc) < b->epsilon) {
      area_bcp = 0; // Rounding.
    }

    facenormal(pc, pa, searchpt, n, 1, NULL);
    area_cap = sqrt(dot(n, n));
    if ((area_cap / area_abc) < b->epsilon) {
      area_cap = 0; // Rounding
    }

    if ((loc == ONFACE) || (loc == OUTSIDE)) {
      facenormal(pa, pb, searchpt, n, 1, NULL);
      area_abp = sqrt(dot(n, n));
      if ((area_abp / area_abc) < b->epsilon) {
        area_abp = 0; // Rounding
      }
    } else { // loc == ONEDGE
      area_abp = 0;
    }

    if (area_abp == 0) {
      if (area_bcp == 0) {
        senextself(*searchsh); 
        loc = ONVERTEX; // p is close to b.
      } else {
        if (area_cap == 0) {
          loc = ONVERTEX; // p is close to a.
        } else {
          loc = ONEDGE; // p is on edge [a,b].
        }
      }
    } else if (area_bcp == 0) {
      if (area_cap == 0) {
        senext2self(*searchsh); 
        loc = ONVERTEX; // p is close to c.
      } else {
        senextself(*searchsh);
        loc = ONEDGE; // p is on edge [b,c].
      }
    } else if (area_cap == 0) {
      senext2self(*searchsh);
      loc = ONEDGE; // p is on edge [c,a].
    } else {
      loc = ONFACE; // p is on face [a,b,c].
    }
  } // if (rflag)

  return loc;
}